

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrappeTorsionType.hpp
# Opt level: O0

ostream * OpenMD::operator<<(ostream *os,TrappeTorsionType *ttt)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"This TrappeTorsionType has below form:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*(double *)(in_RSI + 0x38));
  poVar1 = std::operator<<(poVar1," + ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RSI + 0x40));
  poVar1 = std::operator<<(poVar1,"*(1+cos(phi))");
  poVar1 = std::operator<<(poVar1," + ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RSI + 0x48));
  poVar1 = std::operator<<(poVar1,"*(1-cos(2*phi))");
  poVar1 = std::operator<<(poVar1," + ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RSI + 0x50));
  poVar1 = std::operator<<(poVar1,"*(1+cos(3*phi))");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, TrappeTorsionType& ttt) {
    os << "This TrappeTorsionType has below form:" << std::endl;
    os << ttt.c0_ << " + " << ttt.c1_ << "*(1+cos(phi))"
       << " + " << ttt.c2_ << "*(1-cos(2*phi))"
       << " + " << ttt.c3_ << "*(1+cos(3*phi))" << std::endl;
    return os;
  }